

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSendAdvertisementLowPower
              (UpnpDevice_Handle Hnd,int Exp,int PowerState,int SleepPeriod,int RegistrationState)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  int *__ptr;
  undefined1 local_70 [8];
  ThreadPoolJob job;
  job_arg *adEvent;
  int *ptrMx;
  Handle_Info *pHStack_28;
  int retVal;
  Handle_Info *SInfo;
  int RegistrationState_local;
  int SleepPeriod_local;
  int PowerState_local;
  int Exp_local;
  UpnpDevice_Handle Hnd_local;
  
  pHStack_28 = (Handle_Info *)0x0;
  SInfo._0_4_ = RegistrationState;
  SInfo._4_4_ = SleepPeriod;
  RegistrationState_local = PowerState;
  SleepPeriod_local = Exp;
  PowerState_local = Hnd;
  memset(local_70,0,0x30);
  if (UpnpSdkInit == 1) {
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x79d,
               "Inside UpnpSendAdvertisementLowPower \n");
    HandleLock(".upnp/src/api/upnpapi.c",0x7a0);
    UVar1 = GetHandleInfo(PowerState_local,&stack0xffffffffffffffd8);
    if (UVar1 == HND_DEVICE) {
      if (SleepPeriod_local < 1) {
        SleepPeriod_local = 0x708;
      }
      if (SleepPeriod_local < 0x3d) {
        SleepPeriod_local = 0x3e;
      }
      pHStack_28->MaxAge = SleepPeriod_local;
      pHStack_28->PowerState = RegistrationState_local;
      if (SInfo._4_4_ < 0) {
        SInfo._4_4_ = -1;
      }
      pHStack_28->SleepPeriod = SInfo._4_4_;
      pHStack_28->RegistrationState = (int)SInfo;
      HandleUnlock(".upnp/src/api/upnpapi.c",0x7b2);
      Exp_local = AdvertiseAndReply(1,PowerState_local,SSDP_ALL,(sockaddr *)0x0,(char *)0x0,
                                    (char *)0x0,(char *)0x0,SleepPeriod_local);
      if (Exp_local == 0) {
        __ptr = (int *)malloc(4);
        if (__ptr == (int *)0x0) {
          Exp_local = -0x68;
        }
        else {
          job._40_8_ = malloc(0x760);
          if ((int *)job._40_8_ == (int *)0x0) {
            free(__ptr);
            Exp_local = -0x68;
          }
          else {
            *__ptr = SleepPeriod_local;
            *(int *)job._40_8_ = PowerState_local;
            *(int **)(job._40_8_ + 8) = __ptr;
            HandleLock(".upnp/src/api/upnpapi.c",0x7cb);
            UVar1 = GetHandleInfo(PowerState_local,&stack0xffffffffffffffd8);
            if (UVar1 == HND_DEVICE) {
              TPJobInit((ThreadPoolJob *)local_70,AutoAdvertise,(void *)job._40_8_);
              TPJobSetFreeFunction((ThreadPoolJob *)local_70,free_advertise_arg);
              TPJobSetPriority((ThreadPoolJob *)local_70,MED_PRIORITY);
              iVar2 = TimerThreadSchedule(&gTimerThread,(long)(SleepPeriod_local / 2 + -0x1e),
                                          REL_SEC,(ThreadPoolJob *)local_70,SHORT_TERM,
                                          (int *)(job._40_8_ + 4));
              Exp_local = iVar2;
              if (iVar2 == 0) {
                HandleUnlock(".upnp/src/api/upnpapi.c",0x7f3);
                UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x7f7,
                           "Exiting UpnpSendAdvertisementLowPower \n");
              }
              else {
                HandleUnlock(".upnp/src/api/upnpapi.c",0x7df);
                free_advertise_arg((job_arg *)job._40_8_);
              }
            }
            else {
              HandleUnlock(".upnp/src/api/upnpapi.c",2000);
              free((void *)job._40_8_);
              free(__ptr);
              Exp_local = -100;
            }
          }
        }
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0x7a5);
      Exp_local = -100;
    }
  }
  else {
    Exp_local = -0x74;
  }
  return Exp_local;
}

Assistant:

int UpnpSendAdvertisementLowPower(UpnpDevice_Handle Hnd,
	int Exp,
	int PowerState,
	int SleepPeriod,
	int RegistrationState)
{
	struct Handle_Info *SInfo = NULL;
	int retVal = 0, *ptrMx;
	job_arg *adEvent;
	ThreadPoolJob job;

	memset(&job, 0, sizeof(job));

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSendAdvertisementLowPower \n");

	HandleLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (Exp < 1)
		Exp = DEFAULT_MAXAGE;
	if (Exp <= AUTO_ADVERTISEMENT_TIME * 2)
		Exp = (AUTO_ADVERTISEMENT_TIME + 1) * 2;
	SInfo->MaxAge = Exp;
	SInfo->PowerState = PowerState;
	if (SleepPeriod < 0)
		SleepPeriod = -1;
	SInfo->SleepPeriod = SleepPeriod;
	SInfo->RegistrationState = RegistrationState;
	HandleUnlock(__FILE__, __LINE__);
	retVal = AdvertiseAndReply(1,
		Hnd,
		(enum SsdpSearchType)0,
		(struct sockaddr *)NULL,
		(char *)NULL,
		(char *)NULL,
		(char *)NULL,
		Exp);

	if (retVal != UPNP_E_SUCCESS)
		return retVal;
	ptrMx = (int *)malloc(sizeof(int));
	if (ptrMx == NULL)
		return UPNP_E_OUTOF_MEMORY;
	adEvent = (job_arg *)malloc(sizeof(job_arg));

	if (adEvent == NULL) {
		free(ptrMx);
		return UPNP_E_OUTOF_MEMORY;
	}
	*ptrMx = Exp;
	adEvent->advertise.handle = Hnd;
	adEvent->advertise.Event = ptrMx;

	HandleLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		free(adEvent);
		free(ptrMx);
		return UPNP_E_INVALID_HANDLE;
	}
		#ifdef SSDP_PACKET_DISTRIBUTE
	TPJobInit(&job, (start_routine)AutoAdvertise, adEvent);
	TPJobSetFreeFunction(&job, (free_routine)free_advertise_arg);
	TPJobSetPriority(&job, MED_PRIORITY);
	if ((retVal = TimerThreadSchedule(&gTimerThread,
		     ((Exp / 2) - (AUTO_ADVERTISEMENT_TIME)),
		     REL_SEC,
		     &job,
		     SHORT_TERM,
		     &(adEvent->advertise.eventId))) != UPNP_E_SUCCESS) {
		HandleUnlock(__FILE__, __LINE__);
		free_advertise_arg(adEvent);
		return retVal;
	}
		#else
	TPJobInit(&job, (start_routine)AutoAdvertise, adEvent);
	TPJobSetFreeFunction(&job, (free_routine)free_advertise_arg);
	TPJobSetPriority(&job, MED_PRIORITY);
	if ((retVal = TimerThreadSchedule(&gTimerThread,
		     Exp - AUTO_ADVERTISEMENT_TIME,
		     REL_SEC,
		     &job,
		     SHORT_TERM,
		     &(adEvent->advertise.eventId))) != UPNP_E_SUCCESS) {
		HandleUnlock(__FILE__, __LINE__);
		free_advertise_arg(adEvent);
		return retVal;
	}
		#endif

	HandleUnlock(__FILE__, __LINE__);
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSendAdvertisementLowPower \n");

	return retVal;
}